

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# none_of_suite.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  none_null();
  none_boolean();
  none_array_boolean();
  none_array_string();
  none_array_wstring();
  none_array_u16string();
  none_array_u32string();
  none_map_boolean();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    none_null();
    none_boolean();
    none_array_boolean();
    none_array_string();
    none_array_wstring();
    none_array_u16string();
    none_array_u32string();
    none_map_boolean();

    return boost::report_errors();
}